

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O2

void pnga_matmul_patch_alt
               (char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
               Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,Integer g_c,Integer *clo,
               Integer *chi)

{
  long lVar1;
  long lVar2;
  Integer IVar3;
  Integer IVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint local_f0;
  Integer arank;
  char *local_e0;
  char *local_d8;
  void *local_d0;
  void *local_c8;
  Integer brank;
  Integer btype;
  Integer atype;
  Integer bdims [7];
  Integer adims [7];
  
  local_f0 = (byte)*transa | 0x20;
  local_e0 = transa;
  local_d8 = transb;
  local_d0 = alpha;
  local_c8 = beta;
  if (local_f0 == 0x74) {
    pnga_inquire(g_a,&atype,&arank,adims);
    if (arank < 3) {
      local_f0 = 0xffffffff;
    }
    else {
      uVar8 = 0xffffffffffffffff;
      iVar12 = 0;
      uVar10 = 0xffffffff;
      lVar5 = arank;
      for (uVar7 = 0; (long)uVar7 < lVar5; uVar7 = uVar7 + 1) {
        lVar1 = ahi[uVar7];
        lVar2 = alo[uVar7];
        if ((uint)uVar8 == 0xffffffff && lVar2 < lVar1) {
          iVar12 = iVar12 + 1;
          uVar8 = uVar7 & 0xffffffff;
        }
        else if ((int)uVar10 == -1 && lVar2 < lVar1) {
          iVar12 = iVar12 + 1;
          uVar10 = uVar7 & 0xffffffff;
        }
        else if (lVar2 < lVar1) {
          pnga_error("Patch A has more than 2 dimensions",0);
          lVar5 = arank;
        }
      }
      local_f0 = 0xffffffff;
      if (iVar12 == 1) {
        local_f0 = (uint)uVar8;
      }
    }
    IVar3 = *ahi;
    IVar4 = *alo;
    *alo = alo[1];
    *ahi = ahi[1];
    alo[1] = IVar4;
    ahi[1] = IVar3;
  }
  pnga_inquire(g_b,&btype,&brank,bdims);
  if (brank < 3) {
    iVar12 = -1;
    IVar3 = *bhi;
    IVar4 = *blo;
    *blo = blo[1];
    *bhi = bhi[1];
    blo[1] = IVar4;
    bhi[1] = IVar3;
  }
  else {
    uVar8 = 0xffffffffffffffff;
    uVar7 = 0;
    iVar11 = 0;
    uVar10 = 0xffffffff;
    lVar5 = brank;
    while( true ) {
      iVar9 = (int)uVar10;
      iVar12 = (int)uVar8;
      if (lVar5 <= (long)uVar7) break;
      lVar1 = bhi[uVar7];
      lVar2 = blo[uVar7];
      if (iVar12 == -1 && lVar2 < lVar1) {
        iVar11 = iVar11 + 1;
        uVar8 = uVar7 & 0xffffffff;
      }
      else if (iVar9 == -1 && lVar2 < lVar1) {
        iVar11 = iVar11 + 1;
        uVar10 = uVar7 & 0xffffffff;
      }
      else if (lVar2 < lVar1) {
        pnga_error("Patch A has more than 2 dimensions",0);
        lVar5 = brank;
      }
      uVar7 = uVar7 + 1;
    }
    iVar6 = iVar12;
    if (iVar11 == 1) {
      if ((long)iVar12 < arank + -1) {
        iVar9 = iVar12 + 1;
      }
      else {
        iVar6 = iVar12 + -1;
        iVar9 = iVar12;
      }
    }
    else {
      iVar12 = -1;
    }
    IVar3 = blo[iVar6];
    IVar4 = bhi[iVar6];
    blo[iVar6] = blo[iVar9];
    bhi[iVar6] = bhi[iVar9];
    blo[iVar9] = IVar3;
    bhi[iVar9] = IVar4;
  }
  gai_matmul_patch(local_e0,local_d8,local_d0,local_c8,g_a,alo,ahi,local_f0,g_b,blo,bhi,iVar12,g_c,
                   clo,chi);
  return;
}

Assistant:

void pnga_matmul_patch_alt(char *transa, char *transb, void *alpha, void *beta, 
    Integer g_a, Integer alo[], Integer ahi[], 
    Integer g_b, Integer blo[], Integer bhi[], 
    Integer g_c, Integer clo[], Integer chi[])
{
  int aivec, bivec;
  int e, d, ipos, jpos;
  Integer atype, btype, arank, brank, lo, hi;
  Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM];
  /* if the patch is transposed, find the two indices that correspond to the
   * non-unit dimensions */
  if (*transa == 't' || *transa == 'T') {
    pnga_inquire(g_a, &atype, &arank, adims);
    aivec = -1;
    if (arank > 2) {
      ipos = -1;
      jpos = -1;
      e = 0;
      /* find out how many patch dimensions are greater than 1*/
      for (d=0; d<arank; d++) {
        if (ahi[d]-alo[d] > 0 && ipos == -1) {
          ipos = d;
          e++;
        } else if (ahi[d]-alo[d] > 0 && jpos == -1) {
          jpos = d;
          e++;
        } else if (ahi[d]-alo[d] > 0) {
          pnga_error("Patch A has more than 2 dimensions",0);
        }
      }
      if (e == 0) {
        aivec = -1;
      } else if (e == 1) {
        /* array is a vector */
        aivec = ipos;
        if (ipos < arank-1) {
          jpos = ipos + 1;
        } else {
          jpos = ipos;
          ipos--;
        }
      } else {
        aivec = -1;
      }
    }
    lo = alo[0];
    hi = ahi[0];
    alo[0] = alo[1];
    ahi[0] = ahi[1];
    alo[1] = lo;
    ahi[1] = hi;
  }
  if (*transb == 't' || *transb == 'T') {
    pnga_inquire(g_b, &btype, &brank, bdims);
    bivec = -1;
    if (brank > 2) {
      ipos = -1;
      jpos = -1;
      e = 0;
      /* find out how many patch dimensions are greater than 1*/
      for (d=0; d<brank; d++) {
        if (bhi[d]-blo[d] > 0 && ipos == -1) {
          ipos = d;
          e++;
        } else if (bhi[d]-blo[d] > 0 && jpos == -1) {
          jpos = d;
          e++;
        } else if (bhi[d]-blo[d] > 0) {
          pnga_error("Patch A has more than 2 dimensions",0);
        }
      }
      if (e == 0) {
        bivec = -1;
      } else if (e == 1) {
        /* array is a vector */
        bivec = ipos;
        if (ipos < arank-1) {
          jpos = ipos + 1;
        } else {
          jpos = ipos;
          ipos--;
        }
      } else {
        bivec = -1;
      }
      lo = blo[ipos];
      hi = bhi[ipos];
      blo[ipos] = blo[jpos];
      bhi[ipos] = bhi[jpos];
      blo[jpos] = lo;
      bhi[jpos] = hi;
    } else {
      lo = blo[0];
      hi = bhi[0];
      blo[0] = blo[1];
      bhi[0] = bhi[1];
      blo[1] = lo;
      bhi[1] = hi;
    }
  }


  gai_matmul_patch(transa,transb,alpha,beta,g_a,alo,ahi,aivec,
    g_b,blo,bhi,bivec,g_c,clo,chi);
}